

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::cast_to_variable_store
          (CompilerGLSL *this,uint32_t target_id,string *expr,SPIRType *expr_type)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *pSVar4;
  SPIRType type;
  string local_198;
  undefined1 local_178 [192];
  uint *local_b8;
  size_t local_b0;
  uint local_a0 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_60;
  
  pSVar4 = Compiler::maybe_get_backing_variable(&this->super_Compiler,target_id);
  if (pSVar4 != (SPIRVariable *)0x0) {
    target_id = (pSVar4->super_IVariant).self.id;
  }
  bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)target_id,DecorationBuiltIn);
  if (!bVar2) {
    return;
  }
  uVar3 = Compiler::get_decoration(&this->super_Compiler,(ID)target_id,DecorationBuiltIn);
  iVar1 = *(int *)&(expr_type->super_IVariant).field_0xc;
  local_178._12_4_ = iVar1;
  if ((int)uVar3 < 0x1150) {
    if ((0x14 < uVar3) || ((0x100680U >> (uVar3 & 0x1f) & 1) == 0)) goto LAB_00227b70;
  }
  else if (((uVar3 != 0x1150) && (uVar3 != 0x1396)) && (uVar3 != 0x115c)) goto LAB_00227b70;
  local_178._12_4_ = 7;
LAB_00227b70:
  if (local_178._12_4_ != iVar1) {
    SPIRType::SPIRType((SPIRType *)local_178,expr_type);
    bitcast_expression(&local_198,this,(SPIRType *)local_178,
                       *(BaseType *)&(expr_type->super_IVariant).field_0xc,expr);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    local_178._0_8_ = &PTR__SPIRType_003fd210;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_60);
    local_b0 = 0;
    if (local_b8 != local_a0) {
      free(local_b8);
    }
    local_178._144_8_ = 0;
    if ((TypedID<(spirv_cross::Types)1> *)local_178._136_8_ !=
        (TypedID<(spirv_cross::Types)1> *)(local_178 + 0xa0)) {
      free((void *)local_178._136_8_);
    }
    local_178._96_8_ = 0;
    if ((undefined1 *)local_178._88_8_ != local_178 + 0x70) {
      free((void *)local_178._88_8_);
    }
    local_178._40_8_ = 0;
    if ((undefined1 *)local_178._32_8_ != local_178 + 0x38) {
      free((void *)local_178._32_8_);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::cast_to_variable_store(uint32_t target_id, std::string &expr, const SPIRType &expr_type)
{
	auto *var = maybe_get_backing_variable(target_id);
	if (var)
		target_id = var->self;

	// Only interested in standalone builtin variables.
	if (!has_decoration(target_id, DecorationBuiltIn))
		return;

	auto builtin = static_cast<BuiltIn>(get_decoration(target_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;

	// TODO: Fill in for more builtins.
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInPrimitiveId:
	case BuiltInViewportIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInSampleMask:
	case BuiltInPrimitiveShadingRateKHR:
	case BuiltInShadingRateKHR:
		expected_type = SPIRType::Int;
		break;

	default:
		break;
	}

	if (expected_type != expr_type.basetype)
	{
		auto type = expr_type;
		type.basetype = expected_type;
		expr = bitcast_expression(type, expr_type.basetype, expr);
	}
}